

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

Result __thiscall
testing::internal::FunctionMockerBase<BasicTestLinearExprBuilder<1>_(int)>::PerformDefaultAction
          (FunctionMockerBase<BasicTestLinearExprBuilder<1>_(int)> *this,ArgumentTuple *args,
          string *call_description)

{
  bool bVar1;
  OnCallSpec<BasicTestLinearExprBuilder<1>_(int)> *pOVar2;
  runtime_error *this_00;
  OnCallSpec<BasicTestLinearExprBuilder<1>_(int)> *in_RDX;
  Action<BasicTestLinearExprBuilder<1>_(int)> *in_RSI;
  string message;
  OnCallSpec<BasicTestLinearExprBuilder<1>_(int)> *spec;
  ArgumentTuple *in_stack_ffffffffffffffb0;
  FunctionMockerBase<BasicTestLinearExprBuilder<1>_(int)> *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  IDType local_4;
  
  pOVar2 = FindOnCallSpec(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (pOVar2 == (OnCallSpec<BasicTestLinearExprBuilder<1>_(int)> *)0x0) {
    std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    bVar1 = DefaultValue<BasicTestLinearExprBuilder<1>_>::Exists();
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,(string *)&stack0xffffffffffffffb8);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_4 = (IDType)DefaultValue<BasicTestLinearExprBuilder<1>_>::Get();
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  }
  else {
    OnCallSpec<BasicTestLinearExprBuilder<1>_(int)>::GetAction(in_RDX);
    local_4 = (IDType)Action<BasicTestLinearExprBuilder<1>_(int)>::Perform
                                (in_RSI,(ArgumentTuple *)in_RDX);
  }
  return (Result)local_4;
}

Assistant:

Result PerformDefaultAction(const ArgumentTuple& args,
                              const string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(args);
    }
    const string message = call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }